

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_dppd_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t mask)

{
  float64 fVar1;
  float64 fVar2;
  
  if ((mask & 0x10) == 0) {
    fVar2 = 0;
  }
  else {
    fVar2 = float64_mul_x86_64(d->_d_ZMMReg[0],s->_d_ZMMReg[0],&env->sse_status);
    fVar2 = float64_add_x86_64(0,fVar2,&env->sse_status);
  }
  if ((mask & 0x20) != 0) {
    fVar1 = float64_mul_x86_64(d->_d_ZMMReg[1],s->_d_ZMMReg[1],&env->sse_status);
    fVar2 = float64_add_x86_64(fVar2,fVar1,&env->sse_status);
  }
  fVar1 = fVar2;
  if ((mask & 1) == 0) {
    fVar1 = 0;
  }
  d->_d_ZMMReg[0] = fVar1;
  if ((mask & 2) == 0) {
    fVar2 = 0;
  }
  d->_d_ZMMReg[1] = fVar2;
  return;
}

Assistant:

void glue(helper_dppd, SUFFIX)(CPUX86State *env, Reg *d, Reg *s, uint32_t mask)
{
    float64 iresult = float64_zero;

    if (mask & (1 << 4)) {
        iresult = float64_add(iresult,
                              float64_mul(d->ZMM_D(0), s->ZMM_D(0),
                                          &env->sse_status),
                              &env->sse_status);
    }
    if (mask & (1 << 5)) {
        iresult = float64_add(iresult,
                              float64_mul(d->ZMM_D(1), s->ZMM_D(1),
                                          &env->sse_status),
                              &env->sse_status);
    }
    d->ZMM_D(0) = (mask & (1 << 0)) ? iresult : float64_zero;
    d->ZMM_D(1) = (mask & (1 << 1)) ? iresult : float64_zero;
}